

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Bother(void)

{
  Task *in_RDI;
  string sStack_ab8;
  string local_a98;
  Task bark;
  Task wait;
  Task bother;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,"bother",(allocator<char> *)&bark);
  Task::Task(in_RDI,&local_a98,Compound);
  std::__cxx11::string::~string((string *)&local_a98);
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffff00000000;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(in_RDI->preconditions).satisfiedPredicates,(SatisfiablePredicateParams *)&bark);
  create_Bark(&bark,Bother);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_ab8,"bother",(allocator<char> *)&wait);
  Task::Task(&bother,&sStack_ab8,Simple);
  std::__cxx11::string::~string((string *)&sStack_ab8);
  bother.action = BotherPlayer;
  create_Wait(&wait,3.0);
  Task::addSubtask(in_RDI,&bark);
  Task::addSubtask(in_RDI,&bother);
  Task::addSubtask(in_RDI,&wait);
  Task::~Task(&wait);
  Task::~Task(&bother);
  Task::~Task(&bark);
  return in_RDI;
}

Assistant:

Task create_Bother()
	{
		Task botherGroup {"bother", TaskType::Compound};
		botherGroup.preconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		auto bark = create_Bark(Bark::Bother);

		Task bother {"bother"};
		bother.action = Action::BotherPlayer;		
		
		auto wait = create_Wait(3);

		botherGroup.addSubtask(bark);
		botherGroup.addSubtask(bother);
		botherGroup.addSubtask(wait);

		return botherGroup;
	}